

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArraySampling.cpp
# Opt level: O3

int __thiscall
glcts::TextureCubeMapArraySamplingTest::bufferCollection::init
          (bufferCollection *this,EVP_PKEY_CTX *ctx)

{
  uint height;
  bufferCollection *pbVar1;
  EVP_PKEY_CTX *ctx_00;
  uint uVar2;
  int iVar3;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  int extraout_EAX_02;
  int extraout_EAX_03;
  int extraout_EAX_04;
  int extraout_EAX_05;
  uint *in_RCX;
  ulong uVar4;
  GLuint n_layers;
  uint uVar5;
  uint uVar6;
  GLuint face;
  GLuint cube_face;
  long lVar7;
  vector<float,_std::allocator<float>_> texture_coordinate_buffer_data;
  GLfloat top_level;
  vector<float,_std::allocator<float>_> refZ_buffer_data;
  vector<float,_std::allocator<float>_> grad_y_buffer_data;
  vector<float,_std::allocator<float>_> grad_x_buffer_data;
  vector<float,_std::allocator<float>_> lod_buffer_data;
  vector<float,_std::allocator<float>_> texture_coordinate_for_gather_buffer_data;
  vector<float,_std::allocator<float>_> position_buffer_data;
  GLuint local_140;
  vector<float,_std::allocator<float>_> local_138;
  ulong local_118;
  uint local_110;
  uint local_10c;
  uint local_108;
  float local_104;
  GLuint local_100;
  uint local_fc;
  vector<float,_std::allocator<float>_> local_f8;
  vector<float,_std::allocator<float>_> local_d8;
  vector<float,_std::allocator<float>_> local_b8;
  vector<float,_std::allocator<float>_> local_98;
  vector<float,_std::allocator<float>_> local_78;
  ulong local_60;
  vector<float,_std::allocator<float>_> local_58;
  bufferCollection *local_40;
  EVP_PKEY_CTX *local_38;
  
  uVar5 = in_RCX[2];
  local_118 = (ulong)uVar5 / 6;
  local_110 = *in_RCX;
  local_fc = in_RCX[1];
  uVar2 = local_fc;
  if ((int)local_fc < (int)local_110) {
    uVar2 = local_110;
  }
  local_60 = 1;
  if (1 < (int)uVar2) {
    local_60 = 1;
    uVar4 = (ulong)uVar2;
    do {
      local_60 = (ulong)((int)local_60 + 1);
      uVar2 = (uint)uVar4;
      uVar4 = uVar4 >> 1;
    } while (3 < uVar2);
  }
  local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_138.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_138.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_138.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_98.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_98.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_98.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  uVar4 = (ulong)((uVar5 / 6) * 0xd8);
  std::vector<float,_std::allocator<float>_>::resize(&local_58,uVar4);
  std::vector<float,_std::allocator<float>_>::resize(&local_138,uVar4);
  std::vector<float,_std::allocator<float>_>::resize(&local_78,uVar4);
  uVar2 = (int)local_118 * 0x36;
  std::vector<float,_std::allocator<float>_>::resize(&local_98,(ulong)uVar2);
  std::vector<float,_std::allocator<float>_>::resize(&local_b8,uVar4);
  std::vector<float,_std::allocator<float>_>::resize(&local_d8,uVar4);
  std::vector<float,_std::allocator<float>_>::resize(&local_f8,(ulong)uVar2);
  uVar2 = local_110;
  local_40 = this;
  local_38 = ctx;
  if (5 < uVar5) {
    local_100 = (int)local_118 * 6;
    local_104 = (float)((int)local_60 + -1);
    uVar5 = 0;
    uVar6 = 0;
    local_140 = 0;
    do {
      lVar7 = 0;
      local_10c = uVar6;
      local_108 = uVar5;
      do {
        cube_face = (GLuint)lVar7;
        preparePositionForFace
                  (local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start + uVar5,cube_face,local_140,local_100);
        height = local_fc;
        prepareTextureCoordinatesForFace
                  (local_138.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start + uVar5,uVar2,local_fc,(float)(int)local_140,
                   cube_face);
        prepareTextureCoordinatesForGatherForFace
                  (local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start + uVar5,uVar2,height,(float)(int)local_140,
                   cube_face);
        local_98.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start[uVar6] = 0.0;
        local_98.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start[(ulong)uVar6 + 1] = local_104;
        local_98.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start[(ulong)uVar6 + 2] = 0.0;
        local_98.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start[(ulong)uVar6 + 3] = local_104;
        local_98.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start[(ulong)uVar6 + 4] = 0.0;
        local_98.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start[(ulong)uVar6 + 5] = local_104;
        local_98.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start[(ulong)uVar6 + 6] = 0.0;
        local_98.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start[(ulong)uVar6 + 7] = local_104;
        local_98.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start[(ulong)uVar6 + 8] = 0.0;
        prepareGradXForFace(local_b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start + uVar5,cube_face,
                            local_138.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start + uVar5,uVar2);
        prepareGradYForFace(local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start + uVar5,cube_face,
                            local_138.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start + uVar5,uVar2);
        n_layers = (GLuint)local_118;
        prepareRefZForFace(local_f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_start + uVar6,(GLuint)local_60,cube_face,
                           local_140,n_layers);
        lVar7 = lVar7 + 1;
        uVar6 = uVar6 + 9;
        uVar5 = uVar5 + 0x24;
      } while (lVar7 != 6);
      local_140 = local_140 + 1;
      uVar6 = local_10c + 0x36;
      uVar5 = local_108 + 0xd8;
    } while (local_140 != n_layers);
  }
  ctx_00 = local_38;
  pbVar1 = local_40;
  bufferDefinition::init(&local_40->postion,local_38);
  bufferDefinition::init(&pbVar1->texture_coordinate,ctx_00);
  bufferDefinition::init(&pbVar1->texture_coordinate_for_gather,ctx_00);
  bufferDefinition::init(&pbVar1->lod,ctx_00);
  bufferDefinition::init(&pbVar1->grad_x,ctx_00);
  bufferDefinition::init(&pbVar1->grad_y,ctx_00);
  iVar3 = bufferDefinition::init(&pbVar1->refZ,ctx_00);
  if (local_f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
    iVar3 = extraout_EAX;
  }
  if (local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
    iVar3 = extraout_EAX_00;
  }
  if (local_b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
    iVar3 = extraout_EAX_01;
  }
  if (local_98.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_98.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_98.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
    iVar3 = extraout_EAX_02;
  }
  if (local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
    iVar3 = extraout_EAX_03;
  }
  if (local_138.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_138.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_138.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_138.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
    iVar3 = extraout_EAX_04;
  }
  if (local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
    iVar3 = extraout_EAX_05;
  }
  return iVar3;
}

Assistant:

void TextureCubeMapArraySamplingTest::bufferCollection::init(const glw::Functions& gl, const formatDefinition& format,
															 const resolutionDefinition& resolution)
{
	(void)format;

	static const glw::GLuint n_faces						  = 6;
	static const glw::GLuint n_lods_components				  = 1;
	static const glw::GLuint n_grad_components				  = 4;
	static const glw::GLuint n_points_per_face				  = 9;
	static const glw::GLuint n_position_components			  = 4;
	static const glw::GLuint n_refZ_components				  = 1;
	static const glw::GLuint n_texture_coordinates_components = 4;

	const glw::GLuint n_layers = resolution.m_depth / n_faces;

	const glw::GLuint n_points_per_layer = n_points_per_face * n_faces;
	const glw::GLuint n_total_points	 = n_points_per_layer * n_layers;

	const glw::GLuint n_position_step_per_face			  = n_position_components * n_points_per_face;
	const glw::GLuint n_texture_coordinates_step_per_face = n_texture_coordinates_components * n_points_per_face;
	const glw::GLuint n_lods_step_per_face				  = n_lods_components * n_points_per_face;
	const glw::GLuint n_grad_step_per_face				  = n_grad_components * n_points_per_face;
	const glw::GLuint n_refZ_step_per_face				  = n_refZ_components * n_points_per_face;

	const glw::GLuint n_position_step_per_layer			   = n_faces * n_position_step_per_face;
	const glw::GLuint n_texture_coordinates_step_per_layer = n_faces * n_texture_coordinates_step_per_face;
	const glw::GLuint n_lods_step_per_layer				   = n_faces * n_lods_step_per_face;
	const glw::GLuint n_grad_step_per_layer				   = n_faces * n_grad_step_per_face;
	const glw::GLuint n_refZ_step_per_layer				   = n_faces * n_refZ_step_per_face;

	const glw::GLuint texture_width	= resolution.m_width;
	const glw::GLuint texture_height   = resolution.m_height;
	const glw::GLuint n_mip_map_levels = getMipmapLevelCount(texture_width, texture_height);

	std::vector<glw::GLfloat> position_buffer_data;
	std::vector<glw::GLfloat> texture_coordinate_buffer_data;
	std::vector<glw::GLfloat> texture_coordinate_for_gather_buffer_data;
	std::vector<glw::GLfloat> lod_buffer_data;
	std::vector<glw::GLfloat> grad_x_buffer_data;
	std::vector<glw::GLfloat> grad_y_buffer_data;
	std::vector<glw::GLfloat> refZ_buffer_data;

	position_buffer_data.resize(n_total_points * n_position_components);
	texture_coordinate_buffer_data.resize(n_total_points * n_texture_coordinates_components);
	texture_coordinate_for_gather_buffer_data.resize(n_total_points * n_texture_coordinates_components);
	lod_buffer_data.resize(n_total_points * n_lods_components);
	grad_x_buffer_data.resize(n_total_points * n_grad_components);
	grad_y_buffer_data.resize(n_total_points * n_grad_components);
	refZ_buffer_data.resize(n_total_points * n_refZ_components);

	/* Prepare data */
	for (glw::GLuint layer = 0; layer < n_layers; ++layer)
	{
		const glw::GLfloat layer_coordinate = (float)layer;

		for (glw::GLuint face = 0; face < n_faces; ++face)
		{
			/* Offsets */
			const glw::GLuint position_offset = layer * n_position_step_per_layer + face * n_position_step_per_face;
			const glw::GLuint texture_coordinates_offset =
				layer * n_texture_coordinates_step_per_layer + face * n_texture_coordinates_step_per_face;
			const glw::GLuint lods_offset = layer * n_lods_step_per_layer + face * n_lods_step_per_face;
			const glw::GLuint grad_offset = layer * n_grad_step_per_layer + face * n_grad_step_per_face;
			const glw::GLuint refZ_offset = layer * n_refZ_step_per_layer + face * n_refZ_step_per_face;

			/* Prepare data */
			preparePositionForFace(&position_buffer_data[0] + position_offset, face, layer, n_layers * n_faces);
			prepareTextureCoordinatesForFace(&texture_coordinate_buffer_data[0] + texture_coordinates_offset,
											 texture_width, texture_height, layer_coordinate, face);
			prepareTextureCoordinatesForGatherForFace(&texture_coordinate_for_gather_buffer_data[0] +
														  texture_coordinates_offset,
													  texture_width, texture_height, layer_coordinate, face);
			prepareLodForFace(&lod_buffer_data[0] + lods_offset, n_mip_map_levels);
			prepareGradXForFace(&grad_x_buffer_data[0] + grad_offset, face,
								&texture_coordinate_buffer_data[0] + texture_coordinates_offset, texture_width);
			prepareGradYForFace(&grad_y_buffer_data[0] + grad_offset, face,
								&texture_coordinate_buffer_data[0] + texture_coordinates_offset, texture_width);
			prepareRefZForFace(&refZ_buffer_data[0] + refZ_offset, n_mip_map_levels, face, layer, n_layers);
		}
	}

	/* Initialize buffers */
	postion.init(gl, (glw::GLsizeiptr)(position_buffer_data.size() * sizeof(glw::GLfloat)), &position_buffer_data[0]);
	texture_coordinate.init(gl, (glw::GLsizeiptr)(texture_coordinate_buffer_data.size() * sizeof(glw::GLfloat)),
							&texture_coordinate_buffer_data[0]);
	texture_coordinate_for_gather.init(
		gl, (glw::GLsizeiptr)(texture_coordinate_for_gather_buffer_data.size() * sizeof(glw::GLfloat)),
		&texture_coordinate_for_gather_buffer_data[0]);
	lod.init(gl, (glw::GLsizeiptr)(lod_buffer_data.size() * sizeof(glw::GLfloat)), &lod_buffer_data[0]);
	grad_x.init(gl, (glw::GLsizeiptr)(grad_x_buffer_data.size() * sizeof(glw::GLfloat)), &grad_x_buffer_data[0]);
	grad_y.init(gl, (glw::GLsizeiptr)(grad_y_buffer_data.size() * sizeof(glw::GLfloat)), &grad_y_buffer_data[0]);
	refZ.init(gl, (glw::GLsizeiptr)(refZ_buffer_data.size() * sizeof(glw::GLfloat)), &refZ_buffer_data[0]);
}